

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprPointerLiteral * AllocateTypeStorage(ExpressionEvalContext *ctx,SynBase *source,TypeBase *type)

{
  uint uVar1;
  ExprPointerLiteral **ppEVar2;
  Allocator *pAVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  ExprPointerLiteral *pEVar7;
  TypeRef *pTVar8;
  longlong lVar9;
  char *msg;
  ulong uVar10;
  uchar *__s;
  undefined4 extraout_var_00;
  
  if ((type == (TypeBase *)0x0) || (type->typeID != 0)) {
    uVar6 = (ulong)(ctx->abandonedMemory).count;
    if (uVar6 == 0) {
      lVar9 = type->size;
    }
    else {
      lVar9 = type->size;
      uVar10 = 0;
      do {
        pEVar7 = (ctx->abandonedMemory).data[uVar10];
        if ((long)pEVar7->end - (long)pEVar7->ptr == lVar9) {
          pTVar8 = ExpressionContext::GetReferenceType(ctx->ctx,type);
          (pEVar7->super_ExprBase).type = &pTVar8->super_TypeBase;
          memset(pEVar7->ptr,0,(ulong)(uint)type->size);
          uVar1 = (ctx->abandonedMemory).count;
          if (uVar1 == 0) {
            __assert_fail("count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x172,
                          "T &SmallArray<ExprPointerLiteral *, 32>::back() [T = ExprPointerLiteral *, N = 32]"
                         );
          }
          if (uVar1 <= (uint)uVar10) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<ExprPointerLiteral *, 32>::operator[](unsigned int) [T = ExprPointerLiteral *, N = 32]"
                         );
          }
          ppEVar2 = (ctx->abandonedMemory).data;
          ppEVar2[uVar10] = ppEVar2[uVar1 - 1];
          (ctx->abandonedMemory).count = uVar1 - 1;
          return pEVar7;
        }
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
    }
    if ((long)(ulong)ctx->variableMemoryLimit < lVar9) {
      msg = "ERROR: single variable memory limit";
    }
    else {
      if ((long)(lVar9 + (ulong)ctx->totalMemory) <= (long)(ulong)ctx->totalMemoryLimit) {
        ctx->totalMemory = ctx->totalMemory + (int)lVar9;
        iVar5 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
        __s = (uchar *)CONCAT44(extraout_var,iVar5);
        memset(__s,0,(ulong)(uint)type->size);
        pAVar3 = ctx->ctx->allocator;
        iVar5 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x40);
        pEVar7 = (ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar5);
        pTVar8 = ExpressionContext::GetReferenceType(ctx->ctx,type);
        lVar4 = type->size;
        (pEVar7->super_ExprBase).typeID = 0xc;
        (pEVar7->super_ExprBase).source = source;
        (pEVar7->super_ExprBase).type = &pTVar8->super_TypeBase;
        (pEVar7->super_ExprBase).next = (ExprBase *)0x0;
        (pEVar7->super_ExprBase).listed = false;
        (pEVar7->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e8708;
        pEVar7->ptr = __s;
        pEVar7->end = __s + lVar4;
        if (lVar4 < 0) {
          __assert_fail("ptr <= end",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                        ,0x279,
                        "ExprPointerLiteral::ExprPointerLiteral(SynBase *, TypeBase *, unsigned char *, unsigned char *)"
                       );
        }
        return pEVar7;
      }
      msg = "ERROR: total variable memory limit";
    }
    Report(ctx,msg);
  }
  return (ExprPointerLiteral *)0x0;
}

Assistant:

ExprPointerLiteral* AllocateTypeStorage(ExpressionEvalContext &ctx, SynBase *source, TypeBase *type)
{
	if(isType<TypeError>(type))
		return NULL;

	for(unsigned i = 0; i < ctx.abandonedMemory.size(); i++)
	{
		ExprPointerLiteral *ptr = ctx.abandonedMemory[i];

		if(ptr->end - ptr->ptr == type->size)
		{
			ptr->type = ctx.ctx.GetReferenceType(type);

			memset(ptr->ptr, 0, unsigned(type->size));

			ctx.abandonedMemory[i] = ctx.abandonedMemory.back();
			ctx.abandonedMemory.pop_back();

			return ptr;
		}
	}

	if(type->size > ctx.variableMemoryLimit)
		return (ExprPointerLiteral*)Report(ctx, "ERROR: single variable memory limit");

	if(ctx.totalMemory + type->size > ctx.totalMemoryLimit)
		return (ExprPointerLiteral*)Report(ctx, "ERROR: total variable memory limit");

	ctx.totalMemory += unsigned(type->size);

	unsigned char *memory = (unsigned char*)ctx.ctx.allocator->alloc(unsigned(type->size));

	memset(memory, 0, unsigned(type->size));

	return new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(source, ctx.ctx.GetReferenceType(type), memory, memory + type->size);
}